

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr,REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  REF_EDGE ref_edge;
  REF_CELL *ppRVar6;
  REF_INT *__s;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint local_4c;
  
  ref_edge = (REF_EDGE)malloc(0x20);
  *ref_edge_ptr = ref_edge;
  if (ref_edge == (REF_EDGE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x45,
           "ref_edge_create","malloc *ref_edge_ptr of REF_EDGE_STRUCT NULL");
    return 2;
  }
  ref_edge->n = 0;
  ref_edge->max = 0;
  ref_edge->e2n = (REF_INT *)0x0;
  uVar5 = ref_adj_create(&ref_edge->adj);
  if (uVar5 != 0) {
    uVar13 = (ulong)uVar5;
    pcVar10 = "create adj";
    uVar8 = 0x4d;
    goto LAB_001a55cc;
  }
  pRVar1 = ref_grid->node;
  ref_edge->node = pRVar1;
  if (ref_edge->e2n == (REF_INT *)0x0) {
    if ((long)ref_edge->max == 0) {
      iVar11 = pRVar1->n;
      iVar12 = 100;
      if (0xc < iVar11) {
        iVar12 = iVar11 * 8;
      }
      ref_edge->max = iVar12;
      uVar5 = iVar12 * 2;
      __s = (REF_INT *)malloc((ulong)uVar5 * 4);
      ref_edge->e2n = __s;
      if (__s == (REF_INT *)0x0) {
        bVar3 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x29
               ,"ref_edge_builder_uniq","malloc ref_edge->e2n of REF_INT NULL");
        uVar13 = 2;
      }
      else {
        bVar3 = true;
        bVar4 = true;
        if (iVar12 < 1) goto LAB_001a538c;
        uVar13 = 1;
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        memset(__s,0xff,(ulong)uVar5 << 2);
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x25,
             "ref_edge_builder_uniq","should be zero size",0,(long)ref_edge->max);
      bVar4 = false;
LAB_001a538c:
      bVar3 = bVar4;
      uVar13 = 1;
    }
    if (bVar3) goto LAB_001a539e;
  }
  else {
LAB_001a539e:
    ppRVar6 = ref_grid->cell + 8;
    lVar7 = 8;
    do {
      pRVar2 = *ppRVar6;
      if (0 < pRVar2->max) {
        iVar11 = 0;
        do {
          if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar11] != -1) && (0 < pRVar2->edge_per))
          {
            lVar14 = 0;
            do {
              lVar9 = (long)pRVar2->size_per * (long)iVar11;
              local_4c = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar14 * 2] + lVar9],
                                       pRVar2->c2n
                                       [(long)(int)lVar9 + (long)pRVar2->e2n[lVar14 * 2 + 1]]);
              if (local_4c != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x31,"ref_edge_builder_uniq",(ulong)local_4c,"add uniq");
                goto LAB_001a55a1;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pRVar2->edge_per);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < pRVar2->max);
      }
      ppRVar6 = ref_grid->cell + lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    ppRVar6 = ref_grid->cell + 3;
    lVar7 = 3;
    do {
      pRVar2 = *ppRVar6;
      if (0 < pRVar2->max) {
        iVar11 = 0;
        do {
          if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar11] != -1) && (0 < pRVar2->edge_per))
          {
            lVar14 = 0;
LAB_001a54f3:
            lVar9 = (long)pRVar2->size_per * (long)iVar11;
            local_4c = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar14 * 2] + lVar9],
                                     pRVar2->c2n
                                     [(long)(int)lVar9 + (long)pRVar2->e2n[lVar14 * 2 + 1]]);
            if (local_4c == 0) goto code_r0x001a5562;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   0x3a,"ref_edge_builder_uniq",(ulong)local_4c,"add uniq");
LAB_001a55a1:
            uVar13 = (ulong)local_4c;
            goto LAB_001a55a6;
          }
LAB_001a556f:
          iVar11 = iVar11 + 1;
        } while (iVar11 < pRVar2->max);
      }
      ppRVar6 = ref_grid->cell + lVar7 + 1;
      lVar7 = lVar7 + 1;
      uVar13 = 0;
    } while (lVar7 != 8);
  }
LAB_001a55a6:
  if ((int)uVar13 == 0) {
    return 0;
  }
  pcVar10 = "build edges";
  uVar8 = 0x51;
LAB_001a55cc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar8,
         "ref_edge_create",uVar13,pcVar10);
  return (REF_STATUS)uVar13;
code_r0x001a5562:
  lVar14 = lVar14 + 1;
  if (pRVar2->edge_per <= lVar14) goto LAB_001a556f;
  goto LAB_001a54f3;
}

Assistant:

REF_FCN REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr, REF_GRID ref_grid) {
  REF_EDGE ref_edge;

  ref_malloc(*ref_edge_ptr, 1, REF_EDGE_STRUCT);

  ref_edge = *ref_edge_ptr;

  ref_edge_n(ref_edge) = 0;
  ref_edge_max(ref_edge) = 0;
  ref_edge->e2n = (REF_INT *)NULL;

  RSS(ref_adj_create(&(ref_edge_adj(ref_edge))), "create adj");

  ref_edge_node(ref_edge) = ref_grid_node(ref_grid);

  RSS(ref_edge_builder_uniq(ref_edge, ref_grid), "build edges");

  return REF_SUCCESS;
}